

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void lua_concat(lua_State *L,int n)

{
  StkId pTVar1;
  GCObject *pGVar2;
  
  if (n < 2) {
    if (n == 0) {
      pTVar1 = L->top;
      pGVar2 = (GCObject *)luaS_newlstr(L,"",0);
      (pTVar1->value).gc = pGVar2;
      pTVar1->tt = 4;
      L->top = L->top + 1;
    }
  }
  else {
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
    }
    luaV_concat(L,n,(int)((ulong)((long)L->top - (long)L->base) >> 4) + -1);
    L->top = L->top + -(ulong)(n - 1);
  }
  return;
}

Assistant:

static void lua_concat(lua_State*L,int n){
api_checknelems(L,n);
if(n>=2){
luaC_checkGC(L);
luaV_concat(L,n,cast_int(L->top-L->base)-1);
L->top-=(n-1);
}
else if(n==0){
setsvalue(L,L->top,luaS_newlstr(L,"",0));
api_incr_top(L);
}
}